

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O3

bool __thiscall
vera::Shader::load(Shader *this,string *_fragmentSrc,string *_vertexSrc,ShaderErrorResolve _onError,
                  bool _verbose)

{
  int iVar1;
  GLuint GVar2;
  uint _lineNumber;
  ostream *poVar3;
  DefaultShaders extraout_EDX;
  DefaultShaders extraout_EDX_00;
  DefaultShaders DVar4;
  DefaultShaders extraout_EDX_01;
  DefaultShaders extraout_EDX_02;
  DefaultShaders extraout_EDX_03;
  DefaultShaders extraout_EDX_04;
  DefaultShaders extraout_EDX_05;
  DefaultShaders _type;
  DefaultShaders extraout_EDX_06;
  DefaultShaders _type_00;
  DefaultShaders _type_01;
  DefaultShaders _type_02;
  char *__s;
  bool bVar5;
  string error;
  string lineNum;
  GLint infoLength;
  vector<char,_std::allocator<char>_> infoLog;
  GLint isLinked;
  string local_c0;
  string local_a0;
  ShaderErrorResolve local_80;
  int local_7c;
  string *local_78;
  vector<char,_std::allocator<char>_> local_70;
  int local_54;
  string local_50;
  
  setVersionFromCode(_fragmentSrc);
  local_78 = (string *)&this->m_fragmentSource;
  iVar1 = std::__cxx11::string::compare((char *)local_78);
  DVar4 = extraout_EDX;
  if ((iVar1 == 0) ||
     (iVar1 = std::__cxx11::string::compare((char *)&this->m_vertexSource), DVar4 = extraout_EDX_00,
     iVar1 == 0)) {
    local_80 = _onError;
    getDefaultSrc_abi_cxx11_(&local_c0,(vera *)0xb,DVar4);
    std::__cxx11::string::operator=(local_78,(string *)&local_c0);
    DVar4 = extraout_EDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
      DVar4 = extraout_EDX_02;
    }
    getDefaultSrc_abi_cxx11_(&local_c0,(vera *)0xa,DVar4);
    std::__cxx11::string::operator=((string *)&this->m_vertexSource,(string *)&local_c0);
    _onError = local_80;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
      _onError = local_80;
    }
  }
  GVar2 = compileShader(this,_vertexSrc,0x8b31,false);
  this->m_vertexShader = GVar2;
  if (GVar2 == 0) {
    if (_onError == REVERT_TO_PREVIOUS_SHADER) {
      if (_verbose) {
        __s = "Error compiling vertex shader, reverting to default shader";
LAB_001f74c5:
        puts(__s);
      }
LAB_001f74ca:
      load(this,&this->m_previousFragmentSource,&this->m_previousVertexSource,SHOW_MAGENTA_SHADER,
           _verbose);
    }
    else {
      if (_onError != SHOW_MAGENTA_SHADER) goto LAB_001f705b;
      DVar4 = extraout_EDX_03;
      if (_verbose) {
        puts("Error compiling vertex shader, loading magenta shader");
        DVar4 = extraout_EDX_05;
      }
      getDefaultSrc_abi_cxx11_(&local_c0,(vera *)0xb,DVar4);
      getDefaultSrc_abi_cxx11_(&local_a0,(vera *)0xa,_type);
      load(this,&local_c0,&local_a0,DONT_KEEP_SHADER,_verbose);
LAB_001f7202:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
    }
    bVar5 = false;
  }
  else {
LAB_001f705b:
    GVar2 = compileShader(this,_fragmentSrc,0x8b30,false);
    this->m_fragmentShader = GVar2;
    if (GVar2 == 0) {
      if (_onError == REVERT_TO_PREVIOUS_SHADER) {
        if (_verbose) {
          __s = "Error compiling fragment shader, reverting to default shader";
          goto LAB_001f74c5;
        }
        goto LAB_001f74ca;
      }
      if (_onError == SHOW_MAGENTA_SHADER) {
        DVar4 = extraout_EDX_04;
        if (_verbose) {
          puts("Error compiling fragment shader, loading magenta shader");
          DVar4 = extraout_EDX_06;
        }
        getDefaultSrc_abi_cxx11_(&local_c0,(vera *)0xb,DVar4);
        getDefaultSrc_abi_cxx11_(&local_a0,(vera *)0xa,_type_00);
        load(this,&local_c0,&local_a0,DONT_KEEP_SHADER,_verbose);
        goto LAB_001f7202;
      }
    }
    if (this->m_program != 0) {
      glDeleteProgram();
    }
    GVar2 = glCreateProgram();
    this->m_program = GVar2;
    glAttachShader(GVar2,this->m_vertexShader);
    glAttachShader(this->m_program,this->m_fragmentShader);
    glLinkProgram(this->m_program);
    if (_onError != DONT_KEEP_SHADER) {
      std::__cxx11::string::_M_assign(local_78);
      std::__cxx11::string::_M_assign((string *)&this->m_vertexSource);
      std::__cxx11::string::_M_assign((string *)&this->m_previousFragmentSource);
      std::__cxx11::string::_M_assign((string *)&this->m_previousVertexSource);
    }
    glGetProgramiv(this->m_program,0x8b82,&local_54);
    bVar5 = local_54 != 0;
    if (local_54 == 0) {
      local_7c = 0;
      glGetProgramiv(this->m_program,0x8b84,&local_7c);
      if (1 < (long)local_7c) {
        std::vector<char,_std::allocator<char>_>::vector
                  (&local_70,(long)local_7c,(allocator_type *)&local_c0);
        glGetProgramInfoLog(this->m_program,local_7c,0,
                            local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                  ((string *)&local_c0,
                   local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error linking shader: ",0x16);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_c0._M_dataplus._M_p,
                            local_c0._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        std::__cxx11::string::find((char *)&local_c0,0x30dfd1,0);
        std::__cxx11::string::find_last_of((char *)&local_c0,0x2db4b9,0xffffffffffffffff);
        std::__cxx11::string::substr((ulong)&local_a0,(ulong)&local_c0);
        iVar1 = toInt(&local_a0);
        if (0 < iVar1) {
          toInt(&local_a0);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
          _lineNumber = toInt(&local_a0);
          getLineNumber(&local_50,_fragmentSrc,_lineNumber);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        if (local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      if (_verbose) {
        puts("Linking fail, deleting program and loading error shader");
      }
      glDeleteProgram(this->m_program);
      getDefaultSrc_abi_cxx11_(&local_c0,(vera *)0xb,_type_01);
      getDefaultSrc_abi_cxx11_(&local_a0,(vera *)0xa,_type_02);
      load(this,&local_c0,&local_a0,DONT_KEEP_SHADER,_verbose);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
    }
    else {
      glDeleteShader(this->m_vertexShader);
      glDeleteShader(this->m_fragmentShader);
      this->m_needsReloading = false;
    }
  }
  return bVar5;
}

Assistant:

bool Shader::load(const std::string& _fragmentSrc, const std::string& _vertexSrc, ShaderErrorResolve _onError, bool _verbose) {
    setVersionFromCode(_fragmentSrc);
    if (m_fragmentSource == "" || m_vertexSource == "") {
        m_fragmentSource = getDefaultSrc(FRAG_ERROR);
        m_vertexSource = getDefaultSrc(VERT_ERROR);
    }


    // VERTEX
    m_vertexShader = compileShader(_vertexSrc, GL_VERTEX_SHADER, _verbose);
    if (!m_vertexShader) {
        if (_onError == SHOW_MAGENTA_SHADER) {
            if (_verbose)
                printf("Error compiling vertex shader, loading magenta shader\n");
            load(getDefaultSrc(FRAG_ERROR), getDefaultSrc(VERT_ERROR), DONT_KEEP_SHADER, _verbose);
            return false;
        }
        else if (_onError == REVERT_TO_PREVIOUS_SHADER) {
            if (_verbose)
                printf("Error compiling vertex shader, reverting to default shader\n");
            load(m_previousFragmentSource, m_previousVertexSource, SHOW_MAGENTA_SHADER, _verbose);
            return false;
        }
    }

    // FRAGMENT
    m_fragmentShader = compileShader(_fragmentSrc, GL_FRAGMENT_SHADER, _verbose);
    if (!m_fragmentShader) {
        if (_onError == SHOW_MAGENTA_SHADER) {
            if (_verbose)
                printf("Error compiling fragment shader, loading magenta shader\n");
            load(getDefaultSrc(FRAG_ERROR), getDefaultSrc(VERT_ERROR), DONT_KEEP_SHADER, _verbose);
            return false;
        }
        else if (_onError == REVERT_TO_PREVIOUS_SHADER) {
            if (_verbose)
                printf("Error compiling fragment shader, reverting to default shader\n");
            load(m_previousFragmentSource, m_previousVertexSource, SHOW_MAGENTA_SHADER, _verbose);
            return false;
        }
    }

    // PROGRAM
    if (m_program != 0)
        glDeleteProgram(m_program);
    m_program = glCreateProgram();
    glAttachShader(m_program, m_vertexShader);
    glAttachShader(m_program, m_fragmentShader);
    glLinkProgram(m_program);

    // SUCCESS
    if (_onError != DONT_KEEP_SHADER) {
        // we need to explicitely remember the previous shader or REVERT_TO_PREVIOUS_SHADER always falls through to SHOW_MAGENTA_SHADER.
        m_fragmentSource = _fragmentSrc;
        m_vertexSource = _vertexSrc;
        m_previousFragmentSource = _fragmentSrc;
        m_previousVertexSource = _vertexSrc;
    }

    GLint isLinked;
    glGetProgramiv(m_program, GL_LINK_STATUS, &isLinked);

    if (isLinked == GL_FALSE) {
        GLint infoLength = 0;
        glGetProgramiv(m_program, GL_INFO_LOG_LENGTH, &infoLength);

        #if !defined(SWIG)
        if (infoLength > 1) {
            std::vector<GLchar> infoLog(infoLength);
            glGetProgramInfoLog(m_program, infoLength, NULL, &infoLog[0]);
            std::string error(infoLog.begin(),infoLog.end());
            // printf("Error linking shader:\n%s\n", error);
            std::cerr << "Error linking shader: " << error << std::endl;

            std::size_t start = error.find("line ")+5;
            std::size_t end = error.find_last_of(")");
            std::string lineNum = error.substr(start,end-start);
            if (toInt(lineNum) > 0)
                std::cerr << (unsigned)toInt(lineNum) << ": " << getLineNumber(_fragmentSrc,(unsigned)toInt(lineNum)) << std::endl;
        }
        #endif

        if (_verbose)
            printf("Linking fail, deleting program and loading error shader\n");
        glDeleteProgram(m_program);
        load(getDefaultSrc(FRAG_ERROR), getDefaultSrc(VERT_ERROR), DONT_KEEP_SHADER, _verbose);
        return false;
    }
    else {
        glDeleteShader(m_vertexShader);
        glDeleteShader(m_fragmentShader);

        m_needsReloading = false;
        // m_defineChange = false;
        return true;
    }
}